

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

string * __thiscall
expr_tree::texify_abi_cxx11_(string *__return_storage_ptr__,expr_tree *this,expr_node *node)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *par;
  allocator<char> local_9;
  
  switch(node->type) {
  case '\x01':
    std::__cxx11::to_string(__return_storage_ptr__,(node->value).integer);
    break;
  case '\x02':
    std::__cxx11::to_string(__return_storage_ptr__,(node->value).frac);
    break;
  case '\x03':
    par = &this->variable_;
    goto LAB_001073e5;
  case '\x04':
    par = tld::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          at(&this->parameters_,(node->value).integer);
LAB_001073e5:
    ParToTex(__return_storage_ptr__,par);
    break;
  case '\x05':
    OpToTex_abi_cxx11_(__return_storage_ptr__,*(int *)&node->value);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nil",&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string expr_tree::texify(const expr_node& node)
{
    switch (node.type) {
    case INT:
        return std::to_string(node.value.integer);
    case FRAC:
        return std::to_string(node.value.frac);
    case OP:
        return OpToTex(node.value.integer);
    case VAR:
        return ParToTex(this->variable_);
    case PAR:
        return ParToTex(this->parameters_.at(node.value.integer));
    default:
        return "nil";
    }
}